

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::LineStripRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::TransformerLogLog>::
operator()(LineStripRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::TransformerLogLog>
           *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  unsigned_long_long uVar2;
  unsigned_long_long uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  ImVec2 IVar8;
  int iVar9;
  ImU32 IVar10;
  uint uVar11;
  GetterXsYs<unsigned_long_long> *pGVar12;
  TransformerLogLog *pTVar13;
  ImPlotPlot *pIVar14;
  ImDrawVert *pIVar15;
  ImDrawIdx *pIVar16;
  ImPlotContext *pIVar17;
  ImDrawIdx IVar18;
  long lVar19;
  bool bVar20;
  float fVar21;
  double dVar22;
  double dVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  
  pIVar17 = GImPlot;
  pGVar12 = this->Getter;
  pTVar13 = this->Transformer;
  iVar9 = pGVar12->Count;
  lVar19 = (long)(((pGVar12->Offset + prim + 1) % iVar9 + iVar9) % iVar9) * (long)pGVar12->Stride;
  uVar2 = *(unsigned_long_long *)((long)pGVar12->Xs + lVar19);
  uVar3 = *(unsigned_long_long *)((long)pGVar12->Ys + lVar19);
  dVar22 = log10((((double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  dVar4 = pIVar17->LogDenX;
  pIVar14 = pIVar17->CurrentPlot;
  dVar5 = (pIVar14->XAxis).Range.Min;
  dVar6 = (pIVar14->XAxis).Range.Max;
  dVar23 = log10((((double)CONCAT44(0x45300000,(int)(uVar3 >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) /
                 pIVar14->YAxis[pTVar13->YAxis].Range.Min);
  iVar9 = pTVar13->YAxis;
  pIVar14 = pIVar17->CurrentPlot;
  dVar7 = pIVar14->YAxis[iVar9].Range.Min;
  fVar26 = (float)((((double)(float)(dVar22 / dVar4) * (dVar6 - dVar5) + dVar5) -
                   (pIVar14->XAxis).Range.Min) * pIVar17->Mx +
                  (double)pIVar17->PixelRange[iVar9].Min.x);
  fVar27 = (float)((((double)(float)(dVar23 / pIVar17->LogDenY[iVar9]) *
                     (pIVar14->YAxis[iVar9].Range.Max - dVar7) + dVar7) - dVar7) *
                   pIVar17->My[iVar9] + (double)pIVar17->PixelRange[iVar9].Min.y);
  fVar25 = (this->P1).x;
  fVar28 = (this->P1).y;
  fVar24 = fVar28;
  if (fVar27 <= fVar28) {
    fVar24 = fVar27;
  }
  bVar20 = false;
  if ((fVar24 < (cull_rect->Max).y) &&
     (fVar24 = (float)(-(uint)(fVar27 <= fVar28) & (uint)fVar28 |
                      ~-(uint)(fVar27 <= fVar28) & (uint)fVar27), pfVar1 = &(cull_rect->Min).y,
     bVar20 = false, *pfVar1 <= fVar24 && fVar24 != *pfVar1)) {
    fVar24 = fVar25;
    if (fVar26 <= fVar25) {
      fVar24 = fVar26;
    }
    if (fVar24 < (cull_rect->Max).x) {
      fVar24 = (float)(~-(uint)(fVar26 <= fVar25) & (uint)fVar26 |
                      -(uint)(fVar26 <= fVar25) & (uint)fVar25);
      bVar20 = (cull_rect->Min).x <= fVar24 && fVar24 != (cull_rect->Min).x;
    }
  }
  if (bVar20 != false) {
    fVar24 = this->Weight;
    IVar10 = this->Col;
    IVar8 = *uv;
    fVar25 = fVar26 - fVar25;
    fVar28 = fVar27 - fVar28;
    fVar21 = fVar25 * fVar25 + fVar28 * fVar28;
    if (0.0 < fVar21) {
      if (fVar21 < 0.0) {
        fVar21 = sqrtf(fVar21);
      }
      else {
        fVar21 = SQRT(fVar21);
      }
      fVar25 = fVar25 * (1.0 / fVar21);
      fVar28 = fVar28 * (1.0 / fVar21);
    }
    fVar24 = fVar24 * 0.5;
    fVar25 = fVar25 * fVar24;
    fVar24 = fVar24 * fVar28;
    pIVar15 = DrawList->_VtxWritePtr;
    (pIVar15->pos).x = (this->P1).x + fVar24;
    (pIVar15->pos).y = (this->P1).y - fVar25;
    pIVar15->uv = IVar8;
    pIVar15 = DrawList->_VtxWritePtr;
    pIVar15->col = IVar10;
    pIVar15[1].pos.x = fVar24 + fVar26;
    pIVar15[1].pos.y = fVar27 - fVar25;
    pIVar15[1].uv = IVar8;
    pIVar15 = DrawList->_VtxWritePtr;
    pIVar15[1].col = IVar10;
    pIVar15[2].pos.x = fVar26 - fVar24;
    pIVar15[2].pos.y = fVar25 + fVar27;
    pIVar15[2].uv = IVar8;
    pIVar15 = DrawList->_VtxWritePtr;
    pIVar15[2].col = IVar10;
    pIVar15[3].pos.x = (this->P1).x - fVar24;
    pIVar15[3].pos.y = fVar25 + (this->P1).y;
    pIVar15[3].uv = IVar8;
    pIVar15 = DrawList->_VtxWritePtr;
    pIVar15[3].col = IVar10;
    DrawList->_VtxWritePtr = pIVar15 + 4;
    uVar11 = DrawList->_VtxCurrentIdx;
    pIVar16 = DrawList->_IdxWritePtr;
    IVar18 = (ImDrawIdx)uVar11;
    *pIVar16 = IVar18;
    pIVar16[1] = IVar18 + 1;
    pIVar16[2] = IVar18 + 2;
    pIVar16[3] = IVar18;
    pIVar16[4] = IVar18 + 2;
    pIVar16[5] = IVar18 + 3;
    DrawList->_IdxWritePtr = pIVar16 + 6;
    DrawList->_VtxCurrentIdx = uVar11 + 4;
  }
  IVar8.y = fVar27;
  IVar8.x = fVar26;
  this->P1 = IVar8;
  return bVar20;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        P1 = P2;
        return true;
    }